

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void selectDisplayConnection(timeval *timeout)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  bool bVar4;
  fd_set *__arr;
  uint __i;
  int fd;
  int result;
  fd_set fds;
  timeval *timeout_local;
  
  fds.__fds_bits[0xf] = (__fd_mask)timeout;
  iVar1 = *(int *)(_glfw.x11.display + 0x10);
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    (&fd + (ulong)__arr._4_4_ * 2)[0] = 0;
    (&fd + (ulong)__arr._4_4_ * 2)[1] = 0;
  }
  *(ulong *)(&fd + (long)(iVar1 / 0x40) * 2) =
       1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | *(ulong *)(&fd + (long)(iVar1 / 0x40) * 2);
  do {
    iVar2 = select(iVar1 + 1,(fd_set *)&fd,(fd_set *)0x0,(fd_set *)0x0,
                   (timeval *)fds.__fds_bits[0xf]);
    bVar4 = false;
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      bVar4 = false;
      if (*piVar3 == 4) {
        bVar4 = fds.__fds_bits[0xf] == 0;
      }
    }
  } while (bVar4);
  return;
}

Assistant:

void selectDisplayConnection(struct timeval* timeout)
{
    fd_set fds;
    int result;
    const int fd = ConnectionNumber(_glfw.x11.display);

    FD_ZERO(&fds);
    FD_SET(fd, &fds);

    // NOTE: We use select instead of an X function like XNextEvent, as the
    //       wait inside those are guarded by the mutex protecting the display
    //       struct, locking out other threads from using X (including GLX)
    // NOTE: Only retry on EINTR if there is no timeout, as select is not
    //       required to update it for the time elapsed
    // TODO: Update timeout value manually
    do
    {
        result = select(fd + 1, &fds, NULL, NULL, timeout);
    }
    while (result == -1 && errno == EINTR && timeout == NULL);
}